

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsanchorlayout_p.cpp
# Opt level: O1

void __thiscall QGraphicsAnchorLayoutPrivate::deleteLayoutEdges(QGraphicsAnchorLayoutPrivate *this)

{
  QHash<std::pair<QGraphicsLayoutItem_*,_Qt::AnchorPoint>,_std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_int>_>
  *this_00;
  QGraphicsLayoutItem *pQVar1;
  long in_FS_OFFSET;
  pair<QtGraphicsAnchorLayout::AnchorVertex_*,_int> pVar2;
  pair<QtGraphicsAnchorLayout::AnchorVertex_*,_int> pVar3;
  pair<QGraphicsLayoutItem_*,_Qt::AnchorPoint> local_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->super_QGraphicsLayoutPrivate).super_QGraphicsLayoutItemPrivate.q_ptr;
  local_40.second = AnchorLeft;
  this_00 = &this->m_vertexList;
  local_40.first = pQVar1;
  pVar2 = QHash<std::pair<QGraphicsLayoutItem_*,_Qt::AnchorPoint>,_std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_int>_>
          ::value(this_00,&local_40);
  local_40.second = AnchorRight;
  local_40.first = pQVar1;
  pVar3 = QHash<std::pair<QGraphicsLayoutItem_*,_Qt::AnchorPoint>,_std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_int>_>
          ::value(this_00,&local_40);
  removeAnchor_helper(this,pVar2.first,pVar3.first);
  local_40.second = AnchorTop;
  local_40.first = pQVar1;
  pVar2 = QHash<std::pair<QGraphicsLayoutItem_*,_Qt::AnchorPoint>,_std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_int>_>
          ::value(this_00,&local_40);
  local_40.second = AnchorBottom;
  local_40.first = pQVar1;
  pVar3 = QHash<std::pair<QGraphicsLayoutItem_*,_Qt::AnchorPoint>,_std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_int>_>
          ::value(this_00,&local_40);
  removeAnchor_helper(this,pVar2.first,pVar3.first);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsAnchorLayoutPrivate::deleteLayoutEdges()
{
    Q_Q(QGraphicsAnchorLayout);

    Q_ASSERT(!internalVertex(q, Qt::AnchorHorizontalCenter));
    Q_ASSERT(!internalVertex(q, Qt::AnchorVerticalCenter));

    removeAnchor_helper(internalVertex(q, Qt::AnchorLeft),
                        internalVertex(q, Qt::AnchorRight));
    removeAnchor_helper(internalVertex(q, Qt::AnchorTop),
                        internalVertex(q, Qt::AnchorBottom));
}